

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.c
# Opt level: O3

float orient3dslow(float *pa,float *pb,float *pc,float *pd)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int elen;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float temp16 [16];
  float bdet [64];
  float adet [64];
  float temp32t [32];
  float temp32 [32];
  float cdet [64];
  float deter [192];
  float abdet [128];
  float local_a38;
  float local_a34;
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  undefined8 local_a24;
  float local_a1c;
  float local_a18;
  float local_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  undefined8 local_a04;
  float local_9fc;
  float local_9f8;
  float local_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  undefined8 local_9e4;
  float local_9dc;
  float local_9d8;
  float local_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  undefined8 local_9c4;
  float local_9bc;
  float local_9b8;
  float local_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  undefined8 local_9a4;
  float local_99c;
  float local_998;
  float local_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  undefined8 local_984;
  float local_97c;
  float local_978 [16];
  float local_938 [64];
  float local_838 [64];
  float local_738 [32];
  float local_6b8 [32];
  float local_638 [63];
  float afStack_53c [193];
  float local_238 [130];
  
  fVar8 = *pa;
  fVar1 = pa[2];
  fVar2 = pd[2];
  fVar13 = fVar1 - fVar2;
  fVar9 = *pb;
  fVar11 = pb[1];
  fVar3 = pb[2];
  fVar14 = fVar3 - fVar2;
  fVar4 = pc[2];
  fVar15 = fVar4 - fVar2;
  fVar12 = (float)*(undefined8 *)pd;
  fVar10 = (float)((ulong)*(undefined8 *)pd >> 0x20);
  fVar27 = fVar8 - fVar12;
  fVar31 = (fVar8 - (fVar27 + (fVar8 - fVar27))) + ((fVar8 - fVar27) - fVar12);
  fVar21 = fVar9 - fVar12;
  fVar45 = (fVar9 - (fVar21 + (fVar9 - fVar21))) + ((fVar9 - fVar21) - fVar12);
  fVar32 = fVar11 - fVar10;
  fVar28 = (fVar11 - (fVar32 + (fVar11 - fVar32))) + ((fVar11 - fVar32) - fVar10);
  fVar8 = *pc;
  fVar9 = pa[1];
  fVar22 = fVar9 - fVar10;
  fVar25 = fVar8 - fVar12;
  fVar33 = (fVar9 - (fVar22 + (fVar9 - fVar22))) + ((fVar9 - fVar22) - fVar10);
  fVar35 = (fVar8 - (fVar25 + (fVar8 - fVar25))) + ((fVar8 - fVar25) - fVar12);
  fVar8 = pc[1];
  fVar16 = fVar8 - fVar10;
  fVar23 = (fVar8 - (fVar16 + (fVar8 - fVar16))) + ((fVar8 - fVar16) - fVar10);
  fVar10 = fVar31 * splitter - (fVar31 * splitter - fVar31);
  fVar17 = fVar27 * splitter - (fVar27 * splitter - fVar27);
  fVar24 = splitter * fVar28 - (splitter * fVar28 - fVar28);
  fVar26 = splitter * fVar32 - (splitter * fVar32 - fVar32);
  fVar8 = fVar31 * fVar28;
  fVar9 = fVar31 * fVar32;
  fVar18 = fVar31 - fVar10;
  fVar19 = fVar28 - fVar24;
  fVar20 = fVar32 - fVar26;
  local_9f8 = fVar18 * fVar19 - (((fVar8 - fVar10 * fVar24) - fVar18 * fVar24) - fVar10 * fVar19);
  fVar36 = fVar27 - fVar17;
  fVar11 = fVar27 * fVar28;
  fVar12 = fVar27 * fVar32;
  fVar29 = fVar36 * fVar19 - (((fVar11 - fVar17 * fVar24) - fVar36 * fVar24) - fVar17 * fVar19);
  fVar30 = fVar36 * fVar20 - (((fVar12 - fVar17 * fVar26) - fVar36 * fVar26) - fVar17 * fVar20);
  fVar37 = fVar8 + fVar29;
  fVar38 = fVar9 + fVar30;
  fVar24 = fVar11 + fVar37;
  fVar11 = fVar37 - (fVar24 - fVar11);
  fVar19 = fVar20 * fVar18 - (((fVar9 - fVar10 * fVar26) - fVar26 * fVar18) - fVar10 * fVar20);
  fVar8 = (fVar8 - (fVar37 - (fVar37 - fVar8))) + (fVar29 - (fVar37 - fVar8));
  fVar9 = (fVar9 - (fVar38 - (fVar38 - fVar9))) + (fVar30 - (fVar38 - fVar9));
  fVar30 = fVar19 + fVar8;
  fVar20 = fVar11 + fVar30;
  fVar37 = (fVar11 - (fVar20 - (fVar20 - fVar11))) + (fVar30 - (fVar20 - fVar11));
  fVar11 = fVar24 + fVar20;
  fVar20 = (fVar24 - (fVar11 - (fVar11 - fVar24))) + (fVar20 - (fVar11 - fVar24));
  fVar40 = fVar9 + fVar37;
  fVar24 = fVar20 + fVar40;
  fVar29 = (fVar20 - (fVar24 - (fVar24 - fVar20))) + (fVar40 - (fVar24 - fVar20));
  fVar34 = fVar11 + fVar24;
  fVar20 = (fVar11 - (fVar34 - (fVar34 - fVar11))) + (fVar24 - (fVar34 - fVar11));
  fVar39 = fVar12 + fVar38;
  fVar11 = (fVar12 - (fVar39 - (fVar39 - fVar12))) + (fVar38 - (fVar39 - fVar12));
  fVar12 = fVar11 + fVar29;
  fVar38 = fVar20 + fVar12;
  fVar24 = (fVar20 - (fVar38 - (fVar38 - fVar20))) + (fVar12 - (fVar38 - fVar20));
  fVar26 = fVar24 + fVar39;
  fVar20 = fVar34 + fVar38;
  fVar34 = (fVar34 - (fVar20 - (fVar20 - fVar34))) + (fVar38 - (fVar20 - fVar34));
  local_9f4 = (fVar19 - (fVar30 - fVar8)) + (fVar8 - (fVar30 - (fVar30 - fVar8)));
  fStack_9f0 = (fVar37 - (fVar40 - (fVar40 - fVar37))) + (fVar9 - (fVar40 - fVar37));
  fStack_9ec = (fVar29 - (fVar12 - (fVar12 - fVar29))) + (fVar11 - (fVar12 - fVar29));
  fStack_9e8 = (fVar24 - (fVar26 - (fVar26 - fVar24))) + (fVar39 - (fVar26 - fVar24));
  fVar8 = fVar34 + fVar26;
  local_9dc = fVar20 + fVar8;
  local_9e4 = CONCAT44((fVar20 - (local_9dc - (local_9dc - fVar20))) +
                       (fVar8 - (local_9dc - fVar20)),
                       (fVar34 - (fVar8 - (fVar8 - fVar34))) + (fVar26 - (fVar8 - fVar34)));
  fVar19 = fVar45 * splitter - (fVar45 * splitter - fVar45);
  fVar24 = fVar21 * splitter - (fVar21 * splitter - fVar21);
  fVar12 = -fVar33;
  fVar29 = -fVar22;
  fVar8 = splitter * fVar12 - (fVar33 + splitter * fVar12);
  fVar9 = splitter * fVar29 - (fVar22 + splitter * fVar29);
  fVar38 = fVar45 * fVar12;
  fVar40 = fVar45 * fVar29;
  fVar30 = fVar45 - fVar19;
  fVar11 = fVar12 - fVar8;
  fVar26 = fVar29 - fVar9;
  local_a18 = fVar30 * fVar11 - (((fVar38 - fVar19 * fVar8) - fVar30 * fVar8) - fVar19 * fVar11);
  fVar20 = fVar21 - fVar24;
  fVar12 = fVar12 * fVar21;
  fVar29 = fVar29 * fVar21;
  fVar8 = fVar20 * fVar11 - (((fVar12 - fVar24 * fVar8) - fVar20 * fVar8) - fVar24 * fVar11);
  fVar11 = fVar20 * fVar26 - (((fVar29 - fVar24 * fVar9) - fVar20 * fVar9) - fVar24 * fVar26);
  fVar37 = fVar38 + fVar8;
  fVar34 = fVar40 + fVar11;
  fVar44 = fVar12 + fVar37;
  fVar12 = fVar37 - (fVar44 - fVar12);
  fVar39 = fVar26 * fVar30 - (((fVar40 - fVar19 * fVar9) - fVar9 * fVar30) - fVar19 * fVar26);
  fVar41 = (fVar38 - (fVar37 - (fVar37 - fVar38))) + (fVar8 - (fVar37 - fVar38));
  fVar42 = (fVar40 - (fVar34 - (fVar34 - fVar40))) + (fVar11 - (fVar34 - fVar40));
  fVar37 = fVar39 + fVar41;
  fVar9 = fVar12 + fVar37;
  fVar43 = (fVar12 - (fVar9 - (fVar9 - fVar12))) + (fVar37 - (fVar9 - fVar12));
  fVar8 = fVar44 + fVar9;
  fVar11 = (fVar44 - (fVar8 - (fVar8 - fVar44))) + (fVar9 - (fVar8 - fVar44));
  fVar40 = fVar42 + fVar43;
  fVar9 = fVar11 + fVar40;
  fVar44 = (fVar11 - (fVar9 - (fVar9 - fVar11))) + (fVar40 - (fVar9 - fVar11));
  fVar11 = fVar8 + fVar9;
  fVar8 = (fVar8 - (fVar11 - (fVar11 - fVar8))) + (fVar9 - (fVar11 - fVar8));
  fVar26 = fVar29 + fVar34;
  fVar34 = (fVar29 - (fVar26 - (fVar26 - fVar29))) + (fVar34 - (fVar26 - fVar29));
  fVar38 = fVar34 + fVar44;
  fVar12 = fVar8 + fVar38;
  fVar8 = (fVar8 - (fVar12 - (fVar12 - fVar8))) + (fVar38 - (fVar12 - fVar8));
  fVar9 = fVar8 + fVar26;
  fVar29 = fVar11 + fVar12;
  fVar11 = (fVar11 - (fVar29 - (fVar29 - fVar11))) + (fVar12 - (fVar29 - fVar11));
  local_a14 = (fVar39 - (fVar37 - fVar41)) + (fVar41 - (fVar37 - (fVar37 - fVar41)));
  fStack_a10 = (fVar43 - (fVar40 - (fVar40 - fVar43))) + (fVar42 - (fVar40 - fVar43));
  fStack_a0c = (fVar44 - (fVar38 - (fVar38 - fVar44))) + (fVar34 - (fVar38 - fVar44));
  fStack_a08 = (fVar8 - (fVar9 - (fVar9 - fVar8))) + (fVar26 - (fVar9 - fVar8));
  fVar8 = fVar11 + fVar9;
  local_9fc = fVar29 + fVar8;
  local_a04 = CONCAT44((fVar29 - (local_9fc - (local_9fc - fVar29))) +
                       (fVar8 - (local_9fc - fVar29)),
                       (fVar11 - (fVar8 - (fVar8 - fVar11))) + (fVar9 - (fVar8 - fVar11)));
  fVar11 = splitter * fVar23 - (splitter * fVar23 - fVar23);
  fVar12 = splitter * fVar16 - (splitter * fVar16 - fVar16);
  fVar34 = fVar45 * fVar23;
  fVar45 = fVar45 * fVar16;
  fVar8 = fVar23 - fVar11;
  fVar9 = fVar16 - fVar12;
  local_998 = fVar30 * fVar8 - (((fVar34 - fVar19 * fVar11) - fVar30 * fVar11) - fVar19 * fVar8);
  fVar38 = fVar21 * fVar23;
  fVar21 = fVar21 * fVar16;
  fVar26 = fVar20 * fVar8 - (((fVar38 - fVar24 * fVar11) - fVar20 * fVar11) - fVar24 * fVar8);
  fVar29 = fVar20 * fVar9 - (((fVar21 - fVar24 * fVar12) - fVar20 * fVar12) - fVar24 * fVar9);
  fVar20 = fVar34 + fVar26;
  fVar37 = fVar45 + fVar29;
  fVar11 = fVar38 + fVar20;
  fVar24 = fVar20 - (fVar11 - fVar38);
  fVar8 = fVar9 * fVar30 - (((fVar45 - fVar19 * fVar12) - fVar12 * fVar30) - fVar19 * fVar9);
  fVar34 = (fVar34 - (fVar20 - (fVar20 - fVar34))) + (fVar26 - (fVar20 - fVar34));
  fVar38 = (fVar45 - (fVar37 - (fVar37 - fVar45))) + (fVar29 - (fVar37 - fVar45));
  fVar20 = fVar8 + fVar34;
  fVar12 = fVar24 + fVar20;
  fVar24 = (fVar24 - (fVar12 - (fVar12 - fVar24))) + (fVar20 - (fVar12 - fVar24));
  fVar9 = fVar11 + fVar12;
  fVar11 = (fVar11 - (fVar9 - (fVar9 - fVar11))) + (fVar12 - (fVar9 - fVar11));
  fVar29 = fVar38 + fVar24;
  fVar12 = fVar11 + fVar29;
  fVar19 = (fVar11 - (fVar12 - (fVar12 - fVar11))) + (fVar29 - (fVar12 - fVar11));
  fVar26 = fVar9 + fVar12;
  fVar9 = (fVar9 - (fVar26 - (fVar26 - fVar9))) + (fVar12 - (fVar26 - fVar9));
  fVar30 = fVar21 + fVar37;
  fVar37 = (fVar21 - (fVar30 - (fVar30 - fVar21))) + (fVar37 - (fVar30 - fVar21));
  fVar39 = fVar37 + fVar19;
  fVar21 = fVar9 + fVar39;
  fVar11 = (fVar9 - (fVar21 - (fVar21 - fVar9))) + (fVar39 - (fVar21 - fVar9));
  fVar12 = fVar11 + fVar30;
  fVar9 = fVar26 + fVar21;
  fVar21 = (fVar26 - (fVar9 - (fVar9 - fVar26))) + (fVar21 - (fVar9 - fVar26));
  local_994 = (fVar8 - (fVar20 - fVar34)) + (fVar34 - (fVar20 - (fVar20 - fVar34)));
  fStack_990 = (fVar24 - (fVar29 - (fVar29 - fVar24))) + (fVar38 - (fVar29 - fVar24));
  fStack_98c = (fVar19 - (fVar39 - (fVar39 - fVar19))) + (fVar37 - (fVar39 - fVar19));
  fStack_988 = (fVar11 - (fVar12 - (fVar12 - fVar11))) + (fVar30 - (fVar12 - fVar11));
  fVar8 = fVar21 + fVar12;
  local_97c = fVar9 + fVar8;
  local_984 = CONCAT44((fVar9 - (local_97c - (local_97c - fVar9))) + (fVar8 - (local_97c - fVar9)),
                       (fVar21 - (fVar8 - (fVar8 - fVar21))) + (fVar12 - (fVar8 - fVar21)));
  fVar8 = fVar35 * fVar33;
  fVar12 = fVar22 * fVar35;
  fVar40 = splitter * fVar35 - (splitter * fVar35 - fVar35);
  fVar9 = splitter * fVar25 - (splitter * fVar25 - fVar25);
  fVar20 = -fVar28;
  fVar21 = -fVar32;
  fVar24 = splitter * fVar20 - (splitter * fVar20 + fVar28);
  fVar28 = splitter * fVar21 - (fVar32 + splitter * fVar21);
  fVar32 = fVar35 * fVar20;
  fVar38 = fVar35 * fVar21;
  fVar35 = fVar35 - fVar40;
  fVar11 = fVar25 * fVar20;
  fVar19 = fVar25 * fVar21;
  fVar20 = fVar20 - fVar24;
  fVar21 = fVar21 - fVar28;
  local_9d8 = fVar35 * fVar20 - (((fVar32 - fVar40 * fVar24) - fVar35 * fVar24) - fVar40 * fVar20);
  fVar26 = fVar25 - fVar9;
  fVar29 = fVar26 * fVar20 - (((fVar11 - fVar9 * fVar24) - fVar26 * fVar24) - fVar9 * fVar20);
  fVar30 = fVar26 * fVar21 - (((fVar19 - fVar9 * fVar28) - fVar26 * fVar28) - fVar9 * fVar21);
  fVar37 = fVar32 + fVar29;
  fVar34 = fVar38 + fVar30;
  fVar20 = fVar11 + fVar37;
  fVar24 = fVar37 - (fVar20 - fVar11);
  fVar11 = fVar21 * fVar35 - (((fVar38 - fVar40 * fVar28) - fVar28 * fVar35) - fVar40 * fVar21);
  fVar41 = (fVar32 - (fVar37 - (fVar37 - fVar32))) + (fVar29 - (fVar37 - fVar32));
  fVar42 = (fVar38 - (fVar34 - (fVar34 - fVar38))) + (fVar30 - (fVar34 - fVar38));
  fVar32 = fVar11 + fVar41;
  fVar28 = fVar24 + fVar32;
  fVar37 = (fVar24 - (fVar28 - (fVar28 - fVar24))) + (fVar32 - (fVar28 - fVar24));
  fVar21 = fVar20 + fVar28;
  fVar20 = (fVar20 - (fVar21 - (fVar21 - fVar20))) + (fVar28 - (fVar21 - fVar20));
  fVar39 = fVar42 + fVar37;
  fVar24 = fVar20 + fVar39;
  fVar28 = (fVar20 - (fVar24 - (fVar24 - fVar20))) + (fVar39 - (fVar24 - fVar20));
  fVar38 = fVar21 + fVar24;
  fVar24 = (fVar21 - (fVar38 - (fVar38 - fVar21))) + (fVar24 - (fVar38 - fVar21));
  fVar21 = fVar19 + fVar34;
  fVar19 = (fVar19 - (fVar21 - (fVar21 - fVar19))) + (fVar34 - (fVar21 - fVar19));
  fVar20 = fVar19 + fVar28;
  fVar34 = fVar24 + fVar20;
  fVar29 = (fVar24 - (fVar34 - (fVar34 - fVar24))) + (fVar20 - (fVar34 - fVar24));
  fVar30 = fVar29 + fVar21;
  fVar24 = fVar38 + fVar34;
  fVar34 = (fVar38 - (fVar24 - (fVar24 - fVar38))) + (fVar34 - (fVar24 - fVar38));
  local_9d4 = (fVar11 - (fVar32 - fVar41)) + (fVar41 - (fVar32 - (fVar32 - fVar41)));
  fStack_9d0 = (fVar37 - (fVar39 - (fVar39 - fVar37))) + (fVar42 - (fVar39 - fVar37));
  fStack_9cc = (fVar28 - (fVar20 - (fVar20 - fVar28))) + (fVar19 - (fVar20 - fVar28));
  fStack_9c8 = (fVar29 - (fVar30 - (fVar30 - fVar29))) + (fVar21 - (fVar30 - fVar29));
  fVar11 = fVar34 + fVar30;
  local_9bc = fVar24 + fVar11;
  local_9c4 = CONCAT44((fVar24 - (local_9bc - (local_9bc - fVar24))) +
                       (fVar11 - (local_9bc - fVar24)),
                       (fVar34 - (fVar11 - (fVar11 - fVar34))) + (fVar30 - (fVar11 - fVar34)));
  fVar11 = fVar33 * splitter - (fVar33 * splitter - fVar33);
  fVar19 = fVar22 * splitter - (fVar22 * splitter - fVar22);
  fVar21 = fVar25 * fVar33;
  fVar25 = fVar25 * fVar22;
  fVar33 = fVar33 - fVar11;
  fVar22 = fVar22 - fVar19;
  local_a38 = fVar35 * fVar33 - (((fVar8 - fVar40 * fVar11) - fVar35 * fVar11) - fVar40 * fVar33);
  fVar11 = fVar26 * fVar33 - (((fVar21 - fVar9 * fVar11) - fVar26 * fVar11) - fVar9 * fVar33);
  fVar9 = fVar26 * fVar22 - (((fVar25 - fVar9 * fVar19) - fVar26 * fVar19) - fVar9 * fVar22);
  fVar24 = fVar8 + fVar11;
  fVar26 = fVar12 + fVar9;
  fVar20 = fVar21 + fVar24;
  fVar21 = fVar24 - (fVar20 - fVar21);
  fVar19 = fVar22 * fVar35 - (((fVar12 - fVar40 * fVar19) - fVar19 * fVar35) - fVar40 * fVar22);
  fVar29 = (fVar8 - (fVar24 - (fVar24 - fVar8))) + (fVar11 - (fVar24 - fVar8));
  fVar33 = (fVar12 - (fVar26 - (fVar26 - fVar12))) + (fVar9 - (fVar26 - fVar12));
  fVar11 = fVar19 + fVar29;
  fVar8 = fVar21 + fVar11;
  fVar21 = (fVar21 - (fVar8 - (fVar8 - fVar21))) + (fVar11 - (fVar8 - fVar21));
  fVar9 = fVar20 + fVar8;
  fVar12 = (fVar20 - (fVar9 - (fVar9 - fVar20))) + (fVar8 - (fVar9 - fVar20));
  fVar24 = fVar33 + fVar21;
  fVar8 = fVar12 + fVar24;
  fVar35 = (fVar12 - (fVar8 - (fVar8 - fVar12))) + (fVar24 - (fVar8 - fVar12));
  fVar12 = fVar9 + fVar8;
  fVar8 = (fVar9 - (fVar12 - (fVar12 - fVar9))) + (fVar8 - (fVar12 - fVar9));
  fVar28 = fVar25 + fVar26;
  fVar26 = (fVar25 - (fVar28 - (fVar28 - fVar25))) + (fVar26 - (fVar28 - fVar25));
  fVar25 = fVar26 + fVar35;
  fVar22 = fVar8 + fVar25;
  fVar8 = (fVar8 - (fVar22 - (fVar22 - fVar8))) + (fVar25 - (fVar22 - fVar8));
  fVar9 = fVar8 + fVar28;
  fVar20 = fVar12 + fVar22;
  fVar12 = (fVar12 - (fVar20 - (fVar20 - fVar12))) + (fVar22 - (fVar20 - fVar12));
  local_a34 = (fVar19 - (fVar11 - fVar29)) + (fVar29 - (fVar11 - (fVar11 - fVar29)));
  fStack_a30 = (fVar21 - (fVar24 - (fVar24 - fVar21))) + (fVar33 - (fVar24 - fVar21));
  fStack_a2c = (fVar35 - (fVar25 - (fVar25 - fVar35))) + (fVar26 - (fVar25 - fVar35));
  fStack_a28 = (fVar8 - (fVar9 - (fVar9 - fVar8))) + (fVar28 - (fVar9 - fVar8));
  fVar8 = fVar12 + fVar9;
  local_a1c = fVar20 + fVar8;
  local_a24 = CONCAT44((fVar20 - (local_a1c - (local_a1c - fVar20))) +
                       (fVar8 - (local_a1c - fVar20)),
                       (fVar12 - (fVar8 - (fVar8 - fVar12))) + (fVar9 - (fVar8 - fVar12)));
  fVar9 = -fVar23;
  fVar24 = -fVar16;
  fVar8 = splitter * fVar9 - (splitter * fVar9 + fVar23);
  fVar11 = splitter * fVar24 - (fVar16 + splitter * fVar24);
  fVar35 = fVar31 * fVar9;
  fVar31 = fVar31 * fVar24;
  fVar21 = fVar27 * fVar9;
  fVar27 = fVar27 * fVar24;
  fVar9 = fVar9 - fVar8;
  fVar24 = fVar24 - fVar11;
  local_9b8 = fVar18 * fVar9 - (((fVar35 - fVar10 * fVar8) - fVar18 * fVar8) - fVar10 * fVar9);
  fVar19 = fVar36 * fVar9 - (((fVar21 - fVar17 * fVar8) - fVar36 * fVar8) - fVar17 * fVar9);
  fVar20 = fVar36 * fVar24 - (((fVar27 - fVar17 * fVar11) - fVar36 * fVar11) - fVar17 * fVar24);
  fVar12 = fVar35 + fVar19;
  fVar16 = fVar31 + fVar20;
  fVar9 = fVar21 + fVar12;
  fVar8 = fVar12 - (fVar9 - fVar21);
  fVar23 = fVar24 * fVar18 - (((fVar31 - fVar10 * fVar11) - fVar11 * fVar18) - fVar10 * fVar24);
  fVar35 = (fVar35 - (fVar12 - (fVar12 - fVar35))) + (fVar19 - (fVar12 - fVar35));
  fVar21 = (fVar31 - (fVar16 - (fVar16 - fVar31))) + (fVar20 - (fVar16 - fVar31));
  fVar10 = fVar23 + fVar35;
  fVar11 = fVar8 + fVar10;
  fVar19 = (fVar8 - (fVar11 - (fVar11 - fVar8))) + (fVar10 - (fVar11 - fVar8));
  fVar8 = fVar9 + fVar11;
  fVar9 = (fVar9 - (fVar8 - (fVar8 - fVar9))) + (fVar11 - (fVar8 - fVar9));
  fVar17 = fVar21 + fVar19;
  fVar12 = fVar9 + fVar17;
  fVar11 = (fVar9 - (fVar12 - (fVar12 - fVar9))) + (fVar17 - (fVar12 - fVar9));
  fVar20 = fVar8 + fVar12;
  fVar8 = (fVar8 - (fVar20 - (fVar20 - fVar8))) + (fVar12 - (fVar20 - fVar8));
  fVar18 = fVar27 + fVar16;
  fVar24 = (fVar27 - (fVar18 - (fVar18 - fVar27))) + (fVar16 - (fVar18 - fVar27));
  fVar22 = fVar24 + fVar11;
  fVar16 = fVar8 + fVar22;
  fVar8 = (fVar8 - (fVar16 - (fVar16 - fVar8))) + (fVar22 - (fVar16 - fVar8));
  fVar9 = fVar8 + fVar18;
  fVar12 = fVar20 + fVar16;
  fVar20 = (fVar20 - (fVar12 - (fVar12 - fVar20))) + (fVar16 - (fVar12 - fVar20));
  local_9b4 = (fVar23 - (fVar10 - fVar35)) + (fVar35 - (fVar10 - (fVar10 - fVar35)));
  fStack_9b0 = (fVar19 - (fVar17 - (fVar17 - fVar19))) + (fVar21 - (fVar17 - fVar19));
  fStack_9ac = (fVar11 - (fVar22 - (fVar22 - fVar11))) + (fVar24 - (fVar22 - fVar11));
  fStack_9a8 = (fVar8 - (fVar9 - (fVar9 - fVar8))) + (fVar18 - (fVar9 - fVar8));
  fVar8 = fVar20 + fVar9;
  local_99c = fVar12 + fVar8;
  local_9a4 = CONCAT44((fVar12 - (local_99c - (local_99c - fVar12))) +
                       (fVar8 - (local_99c - fVar12)),
                       (fVar20 - (fVar8 - (fVar8 - fVar20))) + (fVar9 - (fVar8 - fVar20)));
  iVar5 = fast_expansion_sum_zeroelim(8,&local_998,8,&local_9d8,local_978);
  iVar6 = scale_expansion_zeroelim(iVar5,local_978,SUB84((double)fVar13,0),local_6b8);
  iVar5 = scale_expansion_zeroelim
                    (iVar5,local_978,
                     SUB84((double)((fVar1 - (fVar13 + (fVar1 - fVar13))) +
                                   ((fVar1 - fVar13) - fVar2)),0),local_738);
  iVar5 = fast_expansion_sum_zeroelim(iVar6,local_6b8,iVar5,local_738,local_838);
  iVar6 = fast_expansion_sum_zeroelim(8,&local_a38,8,&local_9b8,local_978);
  iVar7 = scale_expansion_zeroelim(iVar6,local_978,SUB84((double)fVar14,0),local_6b8);
  iVar6 = scale_expansion_zeroelim
                    (iVar6,local_978,
                     SUB84((double)((fVar3 - (fVar14 + (fVar3 - fVar14))) +
                                   ((fVar3 - fVar14) - fVar2)),0),local_738);
  iVar6 = fast_expansion_sum_zeroelim(iVar7,local_6b8,iVar6,local_738,local_938);
  iVar7 = fast_expansion_sum_zeroelim(8,&local_9f8,8,&local_a18,local_978);
  elen = scale_expansion_zeroelim(iVar7,local_978,SUB84((double)fVar15,0),local_6b8);
  iVar7 = scale_expansion_zeroelim
                    (iVar7,local_978,
                     SUB84((double)((fVar4 - (fVar15 + (fVar4 - fVar15))) +
                                   ((fVar4 - fVar15) - fVar2)),0),local_738);
  iVar7 = fast_expansion_sum_zeroelim(elen,local_6b8,iVar7,local_738,local_638);
  iVar5 = fast_expansion_sum_zeroelim(iVar5,local_838,iVar6,local_938,local_238);
  iVar5 = fast_expansion_sum_zeroelim(iVar5,local_238,iVar7,local_638,afStack_53c + 1);
  return afStack_53c[iVar5];
}

Assistant:

REAL orient3dslow(pa, pb, pc, pd)
REAL *pa;
REAL *pb;
REAL *pc;
REAL *pd;
{
  INEXACT REAL adx, ady, adz, bdx, bdy, bdz, cdx, cdy, cdz;
  REAL adxtail, adytail, adztail;
  REAL bdxtail, bdytail, bdztail;
  REAL cdxtail, cdytail, cdztail;
  REAL negate, negatetail;
  INEXACT REAL axby7, bxcy7, axcy7, bxay7, cxby7, cxay7;
  REAL axby[8], bxcy[8], axcy[8], bxay[8], cxby[8], cxay[8];
  REAL temp16[16], temp32[32], temp32t[32];
  int temp16len, temp32len, temp32tlen;
  REAL adet[64], bdet[64], cdet[64];
  int alen, blen, clen;
  REAL abdet[128];
  int ablen;
  REAL deter[192];
  int deterlen;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL a0hi, a0lo, a1hi, a1lo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j, _k, _l, _m, _n;
  REAL _0, _1, _2;

  Two_Diff(pa[0], pd[0], adx, adxtail);
  Two_Diff(pa[1], pd[1], ady, adytail);
  Two_Diff(pa[2], pd[2], adz, adztail);
  Two_Diff(pb[0], pd[0], bdx, bdxtail);
  Two_Diff(pb[1], pd[1], bdy, bdytail);
  Two_Diff(pb[2], pd[2], bdz, bdztail);
  Two_Diff(pc[0], pd[0], cdx, cdxtail);
  Two_Diff(pc[1], pd[1], cdy, cdytail);
  Two_Diff(pc[2], pd[2], cdz, cdztail);

  Two_Two_Product(adx, adxtail, bdy, bdytail,
                  axby7, axby[6], axby[5], axby[4],
                  axby[3], axby[2], axby[1], axby[0]);
  axby[7] = axby7;
  negate = -ady;
  negatetail = -adytail;
  Two_Two_Product(bdx, bdxtail, negate, negatetail,
                  bxay7, bxay[6], bxay[5], bxay[4],
                  bxay[3], bxay[2], bxay[1], bxay[0]);
  bxay[7] = bxay7;
  Two_Two_Product(bdx, bdxtail, cdy, cdytail,
                  bxcy7, bxcy[6], bxcy[5], bxcy[4],
                  bxcy[3], bxcy[2], bxcy[1], bxcy[0]);
  bxcy[7] = bxcy7;
  negate = -bdy;
  negatetail = -bdytail;
  Two_Two_Product(cdx, cdxtail, negate, negatetail,
                  cxby7, cxby[6], cxby[5], cxby[4],
                  cxby[3], cxby[2], cxby[1], cxby[0]);
  cxby[7] = cxby7;
  Two_Two_Product(cdx, cdxtail, ady, adytail,
                  cxay7, cxay[6], cxay[5], cxay[4],
                  cxay[3], cxay[2], cxay[1], cxay[0]);
  cxay[7] = cxay7;
  negate = -cdy;
  negatetail = -cdytail;
  Two_Two_Product(adx, adxtail, negate, negatetail,
                  axcy7, axcy[6], axcy[5], axcy[4],
                  axcy[3], axcy[2], axcy[1], axcy[0]);
  axcy[7] = axcy7;

  temp16len = fast_expansion_sum_zeroelim(8, bxcy, 8, cxby, temp16);
  temp32len = scale_expansion_zeroelim(temp16len, temp16, adz, temp32);
  temp32tlen = scale_expansion_zeroelim(temp16len, temp16, adztail, temp32t);
  alen = fast_expansion_sum_zeroelim(temp32len, temp32, temp32tlen, temp32t,
                                     adet);

  temp16len = fast_expansion_sum_zeroelim(8, cxay, 8, axcy, temp16);
  temp32len = scale_expansion_zeroelim(temp16len, temp16, bdz, temp32);
  temp32tlen = scale_expansion_zeroelim(temp16len, temp16, bdztail, temp32t);
  blen = fast_expansion_sum_zeroelim(temp32len, temp32, temp32tlen, temp32t,
                                     bdet);

  temp16len = fast_expansion_sum_zeroelim(8, axby, 8, bxay, temp16);
  temp32len = scale_expansion_zeroelim(temp16len, temp16, cdz, temp32);
  temp32tlen = scale_expansion_zeroelim(temp16len, temp16, cdztail, temp32t);
  clen = fast_expansion_sum_zeroelim(temp32len, temp32, temp32tlen, temp32t,
                                     cdet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  deterlen = fast_expansion_sum_zeroelim(ablen, abdet, clen, cdet, deter);

  return deter[deterlen - 1];
}